

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrassembly.cpp
# Opt level: O2

void __thiscall
TPZDohrAssembly<std::complex<long_double>_>::Read
          (TPZDohrAssembly<std::complex<long_double>_> *this,TPZStream *buf,void *context)

{
  undefined8 in_RAX;
  int f;
  long lVar1;
  long lVar2;
  int ncoarse;
  int nfine;
  
  _ncoarse = in_RAX;
  (*buf->_vptr_TPZStream[0x1d])(buf,&nfine,1);
  (*(this->fFineEqs)._vptr_TPZVec[3])(&this->fFineEqs,(long)nfine);
  lVar2 = 0;
  for (lVar1 = 0; lVar1 < nfine; lVar1 = lVar1 + 1) {
    TPZStream::Read<int>
              (buf,(TPZVec<int> *)((long)&((this->fFineEqs).fStore)->_vptr_TPZVec + lVar2));
    lVar2 = lVar2 + 0x20;
  }
  (*buf->_vptr_TPZStream[0x1d])(buf,&ncoarse,1);
  (*(this->fCoarseEqs)._vptr_TPZVec[3])(&this->fCoarseEqs,(long)ncoarse);
  lVar2 = 0;
  for (lVar1 = 0; lVar1 < ncoarse; lVar1 = lVar1 + 1) {
    TPZStream::Read<int>
              (buf,(TPZVec<int> *)((long)&((this->fCoarseEqs).fStore)->_vptr_TPZVec + lVar2));
    lVar2 = lVar2 + 0x20;
  }
  return;
}

Assistant:

void TPZDohrAssembly<TVar>::Read(TPZStream &buf, void *context)
{
    int nfine;
    buf.Read(&nfine);
    fFineEqs.resize(nfine);
    for (int f=0; f<nfine; f++) {
        buf.Read( fFineEqs[f]);
    }
    int ncoarse;
    buf.Read(&ncoarse);
    fCoarseEqs.resize(ncoarse);
    for (int nc=0; nc<ncoarse; nc++) {
        buf.Read( fCoarseEqs[nc]);
    }    
}